

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_3dm_settings.cpp
# Opt level: O2

bool __thiscall
ON_3dmAnnotationSettings::Write(ON_3dmAnnotationSettings *this,ON_BinaryArchive *file)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  double dVar4;
  ON_UUID local_30;
  
  iVar2 = ON_BinaryArchive::Archive3dmVersion(file);
  bVar1 = ON_BinaryArchive::Write3dmChunkVersion(file,1,(uint)(0x3b < iVar2) * 2 + 2);
  if (((((((bVar1) && (bVar1 = ON_BinaryArchive::WriteDouble(file,1.0), bVar1)) &&
         (bVar1 = ON_BinaryArchive::WriteDouble(file,this->m_textheight), bVar1)) &&
        ((bVar1 = ON_BinaryArchive::WriteDouble(file,this->m_dimexe), bVar1 &&
         (bVar1 = ON_BinaryArchive::WriteDouble(file,this->m_dimexo), bVar1)))) &&
       ((bVar1 = ON_BinaryArchive::WriteDouble(file,this->m_arrowlength), bVar1 &&
        ((bVar1 = ON_BinaryArchive::WriteDouble(file,this->m_arrowwidth), bVar1 &&
         (bVar1 = ON_BinaryArchive::WriteDouble(file,this->m_centermark), bVar1)))))) &&
      (bVar1 = ON_BinaryArchive::WriteInt(file,(uint)this->m_dimunits), bVar1)) &&
     (((bVar1 = ON_BinaryArchive::WriteInt(file,this->m_arrowtype), bVar1 &&
       (bVar1 = ON_BinaryArchive::WriteInt(file,this->m_angularunits), bVar1)) &&
      (bVar1 = ON_BinaryArchive::WriteInt(file,this->m_lengthformat), bVar1)))) {
    bVar1 = ON_BinaryArchive::WriteInt(file,this->m_angleformat);
  }
  else {
    bVar1 = false;
  }
  iVar3 = ON_BinaryArchive::Archive3dmVersion(file);
  if (((bVar1 != false) && (bVar1 = ON_BinaryArchive::WriteInt(file,(uint)(2 < iVar3) * 2), bVar1))
     && ((bVar1 = ON_BinaryArchive::WriteInt(file,this->m_resolution), bVar1 &&
         (bVar1 = ON_BinaryArchive::WriteString(file,&this->m_facename), bVar1)))) {
    dVar4 = WorldViewTextScale(this);
    bVar1 = ON_BinaryArchive::WriteDouble(file,dVar4);
    if ((bVar1) &&
       (bVar1 = ON_BinaryArchive::WriteChar(file,this->m_b_V5_EnableAnnotationScaling), bVar1)) {
      dVar4 = WorldViewHatchScale(this);
      bVar1 = ON_BinaryArchive::WriteDouble(file,dVar4);
      if (bVar1) {
        bVar1 = ON_BinaryArchive::WriteChar(file,this->m_bEnableHatchScaling);
        if (iVar2 < 0x3c || !bVar1) {
          return bVar1 && iVar2 < 0x3c;
        }
        bVar1 = ON_BinaryArchive::WriteChar(file,this->m_bEnableModelSpaceAnnotationScaling);
        if ((bVar1) &&
           (bVar1 = ON_BinaryArchive::WriteChar(file,this->m_bEnableLayoutSpaceAnnotationScaling),
           bVar1)) {
          bVar1 = Default3dmAnnotationSettingsPrivate.m_use_dimension_layer;
          if ((this != &Default) && (this->m_private != (ON_3dmAnnotationSettingsPrivate *)0x0)) {
            bVar1 = this->m_private->m_use_dimension_layer;
          }
          bVar1 = ON_BinaryArchive::WriteBool(file,bVar1);
          if (bVar1) {
            local_30 = DimensionLayerId(this);
            bVar1 = ON_BinaryArchive::WriteUuid(file,&local_30);
            return bVar1;
          }
        }
      }
    }
  }
  return false;
}

Assistant:

bool ON_3dmAnnotationSettings::Write( ON_BinaryArchive& file ) const
{
  int minor_version
    = file.Archive3dmVersion() >= 60
    ? 4
    : 2;

  unsigned int i;
  bool rc = file.Write3dmChunkVersion(1, minor_version);
  // March 22, 2010 - Global DimScale abandoned and moved into DimStyles, so now
  // in older files, the dimscale values are multiplied into the DimStyle lengths and
  // DimScale is written as 1.0

  // March 2017 Add
  /*
    unsigned char m_b_V5_EnableAnnotationScaling = 1;

  // [Lowell 3-28-2013] New fields for V6
  unsigned char m_bEnableModelSpaceAnnotationScaling = 1;
  unsigned char m_bEnableLayoutSpaceAnnotationScaling = 1;
  */
  if (rc) rc = file.WriteDouble(1.0);

  if (rc) rc = file.WriteDouble(m_textheight);
  if (rc) rc = file.WriteDouble(m_dimexe);
  if (rc) rc = file.WriteDouble(m_dimexo);
  if (rc) rc = file.WriteDouble(m_arrowlength);
  if (rc) rc = file.WriteDouble(m_arrowwidth);
  if (rc) rc = file.WriteDouble(m_centermark);

  i = static_cast<unsigned int>(m_dimunits);
  if (rc) rc = file.WriteInt( i );
  if (rc) rc = file.WriteInt( m_arrowtype );
  if (rc) rc = file.WriteInt( m_angularunits );
  if (rc) rc = file.WriteInt( m_lengthformat );
  if (rc) rc = file.WriteInt( m_angleformat );

  const unsigned int textalign 
    = (file.Archive3dmVersion() <= 2)
    ? 0
    : 2;
  if (rc) rc = file.WriteInt( textalign );

  if (rc) rc = file.WriteInt( m_resolution );

  if (rc) rc = file.WriteString( m_facename );

  // Added 25 August 2010 chunk version 1.1
  double d = WorldViewTextScale();
  if (rc) rc = file.WriteDouble(d);
  if (rc) rc = file.WriteChar(m_b_V5_EnableAnnotationScaling);

  // Added 14 January 2011 chunk version 1.2
  d = WorldViewHatchScale();
  if (rc) rc = file.WriteDouble(d);
  if (rc) rc = file.WriteChar(m_bEnableHatchScaling);

  // Added 28 March 2013 chunk version 1.3
  if (minor_version >= 3)
  {
    // [Lowell 3-28-2013] New fields for V6
    if (rc) rc = file.WriteChar(m_bEnableModelSpaceAnnotationScaling);
    if (rc) rc = file.WriteChar(m_bEnableLayoutSpaceAnnotationScaling);
  }

  //  Added 17 April 2023 chunk version 1.4
  if (minor_version >= 4)
  {
    if (rc) rc = file.WriteBool(UseDimensionLayer());
    if (rc) rc = file.WriteUuid(DimensionLayerId());
  }

  return rc;
}